

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_stream_parser.cc
# Opt level: O2

Status * __thiscall
google::protobuf::util::converter::JsonStreamParser::ParseObjectMid
          (Status *__return_storage_ptr__,JsonStreamParser *this,TokenType type)

{
  StringPiece local_48;
  StringPiece local_38;
  ParseType local_24;
  
  if (type == END_OBJECT) {
    Advance(this);
    (*this->ow_->_vptr_ObjectWriter[3])();
    this->recursion_depth_ = this->recursion_depth_ + -1;
  }
  else {
    if (type != VALUE_SEPARATOR) {
      if (type == UNKNOWN) {
        StringPiece::StringPiece(&local_48,"Expected , or } after key:value pair.");
        ReportUnknown(__return_storage_ptr__,this,local_48);
        return __return_storage_ptr__;
      }
      StringPiece::StringPiece(&local_38,"Expected , or } after key:value pair.");
      ReportFailure(__return_storage_ptr__,this,local_38);
      return __return_storage_ptr__;
    }
    Advance(this);
    local_24 = ENTRY;
    std::
    deque<google::protobuf::util::converter::JsonStreamParser::ParseType,_std::allocator<google::protobuf::util::converter::JsonStreamParser::ParseType>_>
    ::emplace_back<google::protobuf::util::converter::JsonStreamParser::ParseType>
              (&(this->stack_).c,&local_24);
  }
  Status::Status(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

util::Status JsonStreamParser::ParseObjectMid(TokenType type) {
  if (type == UNKNOWN) {
    return ReportUnknown("Expected , or } after key:value pair.");
  }

  // Object is complete, advance past the comma and render the EndObject.
  if (type == END_OBJECT) {
    Advance();
    ow_->EndObject();
    --recursion_depth_;
    return util::Status();
  }
  // Found a comma, advance past it and get ready for an entry.
  if (type == VALUE_SEPARATOR) {
    Advance();
    stack_.push(ENTRY);
    return util::Status();
  }
  // Illegal token after key:value pair.
  return ReportFailure("Expected , or } after key:value pair.");
}